

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gameplay.cpp
# Opt level: O2

void __thiscall Gameplay::finalPhase(Gameplay *this)

{
  ostream *poVar1;
  Stronghold *this_00;
  string *psVar2;
  Gameplay *pGVar3;
  int iVar4;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"FINAL PHASE");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  ArrangeTurns(this);
  pGVar3 = this;
  while (pGVar3 = (Gameplay *)
                  (pGVar3->players).super__List_base<Player,_std::allocator<Player>_>._M_impl.
                  _M_node.super__List_node_base._M_next,
        (this->it)._M_node = (_List_node_base *)pGVar3, pGVar3 != this) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Players remaining: ");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Player ");
    this_00 = Player::getStronghold((Player *)((this->it)._M_node + 1));
    psVar2 = BlackCard::getName_abi_cxx11_(&this_00->super_BlackCard);
    poVar1 = std::operator<<(poVar1,(string *)psVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
    Player::discardSurplusFateCards((Player *)((this->it)._M_node + 1));
    pGVar3 = (Gameplay *)(this->it)._M_node;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Stats: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  iVar4 = 1;
  pGVar3 = this;
  while (pGVar3 = (Gameplay *)
                  (pGVar3->players).super__List_base<Player,_std::allocator<Player>_>._M_impl.
                  _M_node.super__List_node_base._M_next,
        (this->it)._M_node = (_List_node_base *)pGVar3, pGVar3 != this) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Player ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
    std::endl<char,std::char_traits<char>>(poVar1);
    Player::PrintPlayerStats((Player *)((this->it)._M_node + 1));
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    iVar4 = iVar4 + 1;
    pGVar3 = (Gameplay *)(this->it)._M_node;
  }
  return;
}

Assistant:

void Gameplay::finalPhase()                                     //phase5: discarding extra hand cards and printing game stats
{
    cout << "FINAL PHASE" << endl <<endl;
    this->ArrangeTurns();

    for (it=players.begin(); it!=players.end(); it++)
    {
        cout <<"Players remaining: "<<endl;
        cout << "Player " << it->getStronghold()->getName() << endl;
        it->discardSurplusFateCards();
    }

    //print game stats
    cout << "Stats: "<<endl;
    int count=1;
    for (it=players.begin(); it!=players.end(); it++)
    {
        cout << "Player " << count << endl;
        it->PrintPlayerStats();
        cout << endl;

        count++;
    }
}